

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O1

void __thiscall Fl_Text_Display::draw_line_numbers(Fl_Text_Display *this,bool param_1)

{
  int h;
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  char lineNumString [16];
  
  h = this->mMaxsize;
  iVar4 = Fl_Widget::active_r((Fl_Widget *)this);
  if (0 < this->mLineNumWidth) {
    iVar5 = Fl_Widget::visible_r((Fl_Widget *)this);
    if (iVar5 != 0) {
      uVar11 = 0;
      if (((this->mHScrollBar->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.flags_ & 2) == 0)
      {
        uVar11 = (this->mHScrollBar->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.h_;
      }
      iVar5 = Fl::box_dx((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
      iVar6 = Fl::box_dy((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
      uVar8 = this->scrollbar_align_;
      uVar7 = 8;
      if (iVar4 == 0) {
        uVar7 = fl_inactive(8);
      }
      iVar6 = (-(uVar8 & 1) & uVar11) + iVar6;
      uVar8 = 0x35;
      if (iVar4 == 0) {
        uVar8 = fl_inactive(0x35);
      }
      iVar4 = (this->super_Fl_Group).super_Fl_Widget.x_;
      iVar1 = (this->super_Fl_Group).super_Fl_Widget.y_;
      iVar2 = (this->super_Fl_Group).super_Fl_Widget.h_;
      uVar3 = this->mLineNumWidth;
      iVar9 = Fl::box_dw((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
                (fl_graphics_driver,(ulong)(uint)(iVar4 + iVar5),(ulong)(uint)(iVar1 + iVar6),
                 (ulong)uVar3,(ulong)(iVar2 - (uVar11 + iVar9)));
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)uVar8);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
                (fl_graphics_driver,(ulong)(uint)((this->super_Fl_Group).super_Fl_Widget.x_ + iVar5)
                 ,(ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.y_,
                 (ulong)(uint)this->mLineNumWidth,
                 (ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.h_);
      uVar11 = 0;
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
                (fl_graphics_driver,0,(ulong)(uint)FL_NORMAL_SIZE);
      if (this->mContinuousWrap == 0) {
        uVar11 = this->mTopLineNum;
      }
      else if (this->mNeedAbsTopLineNum != 0 || this->mLineNumWidth != 0) {
        uVar11 = this->mAbsTopLineNum;
      }
      iVar4 = (this->super_Fl_Group).super_Fl_Widget.y_;
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)uVar7);
      if (0 < this->mNVisibleLines) {
        iVar4 = iVar4 + iVar6 + 3;
        lVar10 = 0;
        do {
          iVar6 = this->mLineStarts[lVar10];
          if (iVar6 == -1) {
LAB_001d53af:
            uVar8 = (uint)(lVar10 == 0);
          }
          else {
            if (iVar6 != 0) {
              uVar8 = Fl_Text_Buffer::char_at(this->mBuffer,iVar6 + -1);
              if (uVar8 != 10) goto LAB_001d53af;
            }
            sprintf(lineNumString,"%d",(ulong)uVar11);
            fl_draw(lineNumString,(this->super_Fl_Group).super_Fl_Widget.x_ + iVar5 + 3,iVar4,
                    this->mLineNumWidth + -6,h,8,(Fl_Image *)0x0,0);
            uVar8 = 1;
          }
          uVar11 = uVar11 + uVar8;
          lVar10 = lVar10 + 1;
          iVar4 = iVar4 + h;
        } while (lVar10 < this->mNVisibleLines);
      }
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
    }
  }
  return;
}

Assistant:

void Fl_Text_Display::draw_line_numbers(bool /*clearAll*/) {
  int Y, line, visLine, lineStart;
  char lineNumString[16];
  int lineHeight = mMaxsize;
  int isactive = active_r() ? 1 : 0;

  // Don't draw if lineNumWidth == 0 (line numbers are hidden),
  // or widget is not yet realized
  if (mLineNumWidth <= 0 || !visible_r())
    return;

  // Make sure we set the correct clipping range for line numbers.
  // Take scrollbars and positions into account.
  int hscroll_h = mHScrollBar->visible() ? mHScrollBar->h() : 0;
  int xoff = Fl::box_dx(box());
  int yoff = Fl::box_dy(box()) + ((scrollbar_align()&FL_ALIGN_TOP)?hscroll_h:0);

#ifndef LINENUM_LEFT_OF_VSCROLL
  int vscroll_w = mVScrollBar->visible() ? mVScrollBar->w() : 0;
  if (scrollbar_align()&FL_ALIGN_LEFT)
    xoff += vscroll_w;
#endif

  Fl_Color fgcolor = isactive ? linenumber_fgcolor() : fl_inactive(linenumber_fgcolor());
  Fl_Color bgcolor = isactive ? linenumber_bgcolor() : fl_inactive(linenumber_bgcolor());
  fl_push_clip(x() + xoff,
               y() + yoff,
               mLineNumWidth,
               h() - Fl::box_dw(box()) - hscroll_h);
  {
    // Set background color for line number area -- LZA / STR# 2621
    // Erase background
    fl_color(bgcolor);
    fl_rectf(x()+xoff, y(), mLineNumWidth, h());

    // Draw separator line
    //fl_color(180,180,180);
    //fl_line(x()+mLineNumWidth-1, y(), x()+mLineNumWidth-1, y()+h());

    // Draw line number text
    fl_font(linenumber_font(), linenumber_size());

    Y = y() + yoff;
    line = get_absolute_top_line_number();

    // set font color for line numbers
    fl_color(fgcolor);
    for (visLine=0; visLine < mNVisibleLines; visLine++) {
      lineStart = mLineStarts[visLine];
      if (lineStart != -1 && (lineStart==0 || buffer()->char_at(lineStart-1)=='\n')) {
	sprintf(lineNumString, linenumber_format(), line);
	int xx = x() + xoff + 3,
	    yy = Y + 3,
	    ww = mLineNumWidth - (3*2),
	    hh = lineHeight;
	fl_draw(lineNumString, xx, yy, ww, hh, linenumber_align(), 0, 0);
	//DEBUG fl_rect(xx, yy, ww, hh);
	line++;
      } else {
	if (visLine == 0) line++;
      }
      Y += lineHeight;
    }
  } 
  fl_pop_clip();
}